

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O2

string * PrintHRule_abi_cxx11_(string *__return_storage_ptr__,size_t additionalColumns)

{
  ostream *poVar1;
  long lVar2;
  bool bVar3;
  string groupColumn;
  string column;
  string firstColumn;
  stringstream ss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  stringstream local_1b0 [16];
  ostream local_1a0 [376];
  
  celero::console::SetConsoleColor(Default);
  std::__cxx11::stringstream::stringstream(local_1b0);
  std::__cxx11::string::string((string *)&local_210,":",(allocator *)&local_230);
  std::__cxx11::string::string((string *)&local_230,":",(allocator *)&local_1f0);
  while (local_210._M_string_length < 0xf) {
    std::__cxx11::string::append((char *)&local_210);
  }
  while (local_230._M_string_length < GlobalGroupNameColumnWidth) {
    std::__cxx11::string::append((char *)&local_230);
  }
  std::operator+(&local_1f0,&local_210,":|");
  std::operator+(&local_1d0,&local_230,":|");
  std::__cxx11::string::operator=((string *)&local_230,(string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::append((char *)&local_210);
  poVar1 = std::operator<<(local_1a0,"|");
  std::operator<<(poVar1,(string *)&local_230);
  lVar2 = additionalColumns + 8;
  while (bVar3 = lVar2 != 0, lVar2 = lVar2 + -1, bVar3) {
    std::operator<<(local_1a0,(string *)&local_210);
  }
  std::endl<char,std::char_traits<char>>(local_1a0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::stringstream::~stringstream(local_1b0);
  return __return_storage_ptr__;
}

Assistant:

std::string PrintHRule(const size_t additionalColumns = 0)
{
	celero::console::SetConsoleColor(celero::console::ConsoleColor::Default);

	std::stringstream ss;
	std::string column{":"};
	std::string groupColumn{":"};

	while(column.length() < PrintConstants::ColumnWidth)
	{
		column += "-";
	}

	while(groupColumn.length() < GlobalGroupNameColumnWidth)
	{
		groupColumn += "-";
	}

	std::string firstColumn = column + ":|";
	groupColumn = groupColumn + ":|";

	column += "-:|";

	ss << "|" << groupColumn;

	for(size_t i = 0; i < PrintConstants::NumberOfColumns + additionalColumns - 1; ++i)
	{
		ss << column;
	}

	ss << std::endl;

	return ss.str();
}